

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  Vector3f d;
  Point3<float> p;
  Point3f o;
  float fVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  const_reference pvVar6;
  float *pfVar7;
  long in_RDI;
  Float FVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  Bounds2<float> BVar21;
  Vector3<float> VVar22;
  Ray *in_stack_00000058;
  Ray *in_stack_00000060;
  RealisticCamera *in_stack_00000068;
  Ray testOut;
  Ray testRay;
  Point2f pd;
  Point2f u2;
  int i;
  Bounds2f pupilBounds;
  int pupilIndex;
  Float r;
  Point3f pFilm;
  Float u;
  Float filmDiagonal;
  char *in_stack_00000320;
  Float in_stack_00000328;
  Float in_stack_0000032c;
  RealisticCamera *in_stack_00000330;
  float in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  Ray *in_stack_fffffffffffffe50;
  FILE *__stream;
  Point3<float> *in_stack_fffffffffffffe58;
  undefined4 local_198;
  float in_stack_fffffffffffffe6c;
  undefined4 uVar23;
  undefined8 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  RNG *u_00;
  float in_stack_fffffffffffffe90;
  Tuple2<pbrt::Point2,_float> local_70 [2];
  int local_60;
  Tuple2<pbrt::Point2,_float> local_5c;
  Tuple2<pbrt::Point2,_float> local_54;
  Bounds2<float> local_4c;
  int local_3c;
  int local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_20;
  Float local_c;
  undefined1 auVar16 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar20 [56];
  
  local_c = Film::Diagonal((Film *)in_stack_fffffffffffffe50);
  if ((TestExitPupilBounds()::rng == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestExitPupilBounds()::rng), iVar3 != 0)) {
    RNG::RNG(&TestExitPupilBounds::rng);
    __cxa_guard_release(&TestExitPupilBounds()::rng);
  }
  local_20 = RNG::Uniform<float>((RNG *)in_stack_fffffffffffffe50);
  Point3<float>::Point3
            (&in_stack_fffffffffffffe50->o,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0.0);
  auVar17._0_4_ = local_c / 2.0;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_30 = local_2c / auVar17._0_4_;
  sVar4 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448));
  fVar1 = local_30;
  local_38 = (int)sVar4 + -1;
  sVar4 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448));
  auVar17 = vcvtusi2ss_avx512f(auVar17,sVar4 - 1);
  auVar20 = ZEXT856(auVar17._8_8_);
  dVar9 = pstd::floor((double)(ulong)(uint)(fVar1 * auVar17._0_4_));
  local_3c = (int)SUB84(dVar9,0);
  auVar16 = extraout_var;
  piVar5 = std::min<int>(&local_38,&local_3c);
  local_34 = *piVar5;
  pvVar6 = pstd::
           vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
           operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                       *)(in_RDI + 0x448),(long)local_34);
  local_4c.pMin.super_Tuple2<pbrt::Point2,_float> = (pvVar6->pMin).super_Tuple2<pbrt::Point2,_float>
  ;
  local_4c.pMax.super_Tuple2<pbrt::Point2,_float> = (pvVar6->pMax).super_Tuple2<pbrt::Point2,_float>
  ;
  iVar3 = local_34 + 1;
  sVar4 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448));
  if (iVar3 < (int)sVar4) {
    pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
    operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448),(long)(local_34 + 1));
    BVar21 = Union<float>((Bounds2<float> *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          (Bounds2<float> *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    auVar19._0_8_ = BVar21.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar19._8_56_ = auVar20;
    auVar13._0_8_ = BVar21.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar13._8_56_ = auVar16;
    local_5c = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar13._0_16_);
    local_54 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar19._0_16_);
    local_4c.pMin.super_Tuple2<pbrt::Point2,_float> = local_5c;
    local_4c.pMax.super_Tuple2<pbrt::Point2,_float> = local_54;
  }
  local_60 = 0;
  while( true ) {
    if (999 < local_60) {
      fprintf(_stderr,".");
      return;
    }
    u_00 = &TestExitPupilBounds::rng;
    RNG::Uniform<float>((RNG *)in_stack_fffffffffffffe50);
    RNG::Uniform<float>((RNG *)in_stack_fffffffffffffe50);
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe48);
    auVar14._0_8_ = SampleUniformDiskConcentric((Point2f)u_00);
    auVar14._8_56_ = extraout_var_00;
    local_70[0] = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar14._0_16_);
    FVar8 = RearElementRadius((RealisticCamera *)0x87010f);
    Tuple2<pbrt::Point2,float>::operator*=((Tuple2<pbrt::Point2,float> *)local_70,FVar8);
    Point3<float>::Point3
              (&in_stack_fffffffffffffe50->o,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0.0
              );
    auVar16 = ZEXT856(0);
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe78;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe70;
    p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    VVar22 = Point3<float>::operator-(in_stack_fffffffffffffe58,p);
    auVar15._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar16;
    vmovlpd_avx(auVar15._0_16_);
    Medium::TaggedPointer
              ((Medium *)in_stack_fffffffffffffe50,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    o.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe90;
    o.super_Tuple3<pbrt::Point3,_float>.x = SUB84(u_00,0);
    o.super_Tuple3<pbrt::Point3,_float>.y = SUB84(u_00,4);
    d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffe70;
    d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe6c;
    Ray::Ray(in_stack_fffffffffffffe50,o,d,in_stack_fffffffffffffe4c,(Medium *)0x870274);
    Ray::Ray(in_stack_fffffffffffffe50);
    FVar8 = TraceLensesFromFilm(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (((FVar8 != 0.0) || (NAN(FVar8))) &&
       (bVar2 = Inside<float>((Point2<float>)local_70[0],&local_4c), !bVar2)) break;
    local_60 = local_60 + 1;
  }
  dVar9 = (double)local_70[0].x;
  dVar10 = (double)local_70[0].y;
  __stream = _stderr;
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)&local_4c,0);
  local_198 = SUB84((double)*pfVar7,0);
  uVar23 = (undefined4)((ulong)(double)*pfVar7 >> 0x20);
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)&local_4c,1);
  dVar11 = (double)*pfVar7;
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]
                     (&local_4c.pMax.super_Tuple2<pbrt::Point2,_float>,0);
  dVar12 = (double)*pfVar7;
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]
                     (&local_4c.pMax.super_Tuple2<pbrt::Point2,_float>,1);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar10;
  fprintf(__stream,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",dVar9,dVar10,
          CONCAT44(uVar23,local_198),dVar11,dVar12,(double)*pfVar7);
  sVar4 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448));
  vcvtusi2ss_avx512f(auVar18,sVar4);
  auVar17 = (undefined1  [16])0x0;
  RenderExitPupil(in_stack_00000330,in_stack_0000032c,in_stack_00000328,in_stack_00000320);
  sVar4 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x448));
  vcvtusi2ss_avx512f(auVar17,sVar4);
  RenderExitPupil(in_stack_00000330,in_stack_0000032c,in_stack_00000328,in_stack_00000320);
  RenderExitPupil(in_stack_00000330,in_stack_0000032c,in_stack_00000328,in_stack_00000320);
  exit(0);
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   pstd::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}